

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

Aig_Man_t *
Saig_ManRetimeMinArea
          (Aig_Man_t *p,int nMaxIters,int fForwardOnly,int fBackwardOnly,int fInitial,int fVerbose)

{
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar1;
  Aig_Man_t *pAVar2;
  Aig_Man_t *p_01;
  bool bVar3;
  char *__s;
  int iVar4;
  bool bVar5;
  
  p_00 = Aig_ManDupSimple(p);
  if (fBackwardOnly == 0) {
    bVar3 = false;
    iVar4 = 0;
    if (0 < nMaxIters) {
      iVar4 = nMaxIters;
    }
    while( true ) {
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if ((bVar5) || (p_00->nRegs == 0)) goto LAB_0059e267;
      pVVar1 = Nwk_ManDeriveRetimingCut(p_00,1,fVerbose);
      if (p_00->nRegs <= pVVar1->nSize) break;
      pAVar2 = Saig_ManRetimeDupForward(p_00,pVVar1);
      Aig_ManStop(p_00);
      Vec_PtrFree(pVVar1);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,pAVar2);
      }
      bVar3 = true;
      p_00 = pAVar2;
    }
    if (fVerbose != 0 && !bVar3) {
      puts("Forward retiming cannot reduce registers.");
    }
    Vec_PtrFree(pVVar1);
  }
LAB_0059e267:
  if (fInitial == 0 && fForwardOnly == 0) {
    iVar4 = 0;
    if (nMaxIters < 1) {
      nMaxIters = iVar4;
    }
    bVar3 = false;
    while( true ) {
      bVar5 = nMaxIters == 0;
      nMaxIters = nMaxIters + -1;
      if ((bVar5) || (p_00->nRegs == 0)) goto LAB_0059e3e8;
      pVVar1 = Nwk_ManDeriveRetimingCut(p_00,0,fVerbose);
      if (p_00->nRegs <= pVVar1->nSize) break;
      pAVar2 = Saig_ManRetimeDupBackward(p_00,pVVar1,(Vec_Int_t *)0x0);
      Aig_ManStop(p_00);
      Vec_PtrFree(pVVar1);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,pAVar2);
      }
      iVar4 = 1;
      bVar3 = true;
      p_00 = pAVar2;
    }
    if (fVerbose != 0 && iVar4 == 0) {
      puts("Backward retiming cannot reduce registers.");
    }
    Vec_PtrFree(pVVar1);
  }
  else {
    if (fForwardOnly != 0 || fInitial == 0) {
      return p_00;
    }
    iVar4 = 0;
    if (nMaxIters < 1) {
      nMaxIters = iVar4;
    }
    bVar3 = false;
    while( true ) {
      bVar5 = nMaxIters == 0;
      nMaxIters = nMaxIters + -1;
      if ((bVar5) || (p_00->nRegs == 0)) goto LAB_0059e3e8;
      pAVar2 = Aig_ManDupSimple(p_00);
      p_01 = Saig_ManRetimeMinAreaBackward(pAVar2,fVerbose);
      Aig_ManStop(pAVar2);
      if (p_01 == (Aig_Man_t *)0x0) break;
      Saig_ManExposeBadRegs(p_01,p_01->nTruePos - p_00->nTruePos);
      Aig_ManStop(p_00);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,p_01);
      }
      iVar4 = 1;
      bVar3 = true;
      p_00 = p_01;
    }
    if (fVerbose != 0 && (char)iVar4 == '\0') {
      __s = "Backward retiming cannot reduce registers.";
      goto LAB_0059e401;
    }
  }
LAB_0059e3e8:
  if (bVar3 && (fInitial == 0 && fForwardOnly == 0)) {
    __s = "Assuming const-0 init-state after backward retiming. Result will not verify.";
LAB_0059e401:
    puts(__s);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManRetimeMinArea( Aig_Man_t * p, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose )
{
    Vec_Ptr_t * vCut;
    Aig_Man_t * pNew, * pTemp, * pCopy;
    int i, fChanges;
    pNew = Aig_ManDupSimple( p );
    // perform several iterations of forward retiming
    fChanges = 0;
    if ( !fBackwardOnly )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        vCut = Nwk_ManDeriveRetimingCut( pNew, 1, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            if ( fVerbose && !fChanges )
                printf( "Forward retiming cannot reduce registers.\n" );
            Vec_PtrFree( vCut );
            break;
        }
        pNew = Saig_ManRetimeDupForward( pTemp = pNew, vCut );
        Aig_ManStop( pTemp );
        Vec_PtrFree( vCut );
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    // perform several iterations of backward retiming
    fChanges = 0;
    if ( !fForwardOnly && !fInitial )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        vCut = Nwk_ManDeriveRetimingCut( pNew, 0, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            if ( fVerbose && !fChanges )
                printf( "Backward retiming cannot reduce registers.\n" );
            Vec_PtrFree( vCut );
            break;
        }
        pNew = Saig_ManRetimeDupBackward( pTemp = pNew, vCut, NULL );
        Aig_ManStop( pTemp );
        Vec_PtrFree( vCut );
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    else if ( !fForwardOnly && fInitial )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        pCopy = Aig_ManDupSimple( pNew );
        pTemp = Saig_ManRetimeMinAreaBackward( pCopy, fVerbose );
        Aig_ManStop( pCopy );
        if ( pTemp == NULL )
        {
            if ( fVerbose && !fChanges )
                printf( "Backward retiming cannot reduce registers.\n" );
            break;
        }
        Saig_ManExposeBadRegs( pTemp, Saig_ManPoNum(pTemp) - Saig_ManPoNum(pNew) );
        Aig_ManStop( pNew );
        pNew = pTemp;
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    if ( !fForwardOnly && !fInitial && fChanges )
        printf( "Assuming const-0 init-state after backward retiming. Result will not verify.\n" );
    return pNew;
}